

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O1

uint16_t __thiscall AmpIO::ReadCurrentITermLimitRaw(AmpIO *this,uint index)

{
  BasePort *pBVar1;
  uint in_EAX;
  uint32_t read_data;
  undefined8 uStack_8;
  
  uStack_8 = (ulong)in_EAX;
  pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
  if (pBVar1 != (BasePort *)0x0) {
    (*pBVar1->_vptr_BasePort[0x23])
              (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,
               (ulong)(index * 0x10 + 0x10 | 0x9003),(long)&uStack_8 + 4);
  }
  return uStack_8._4_2_;
}

Assistant:

uint16_t AmpIO::ReadCurrentITermLimitRaw(unsigned int index) const
{
    uint32_t read_data = 0;
    if (port)
        port->ReadQuadlet(BoardId, ADDR_MOTOR_CONTROL << 12 | (index + 1) << 4 | OFF_CURRENT_I_TERM_LIMIT, read_data);
    return read_data;
}